

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACO.h
# Opt level: O1

void __thiscall
imrt::ACO::initializeHeuristic
          (ACO *this,vector<double,_std::allocator<double>_> *w,
          vector<double,_std::allocator<double>_> *Zmin,
          vector<double,_std::allocator<double>_> *Zmax,
          vector<imrt::Volume,_std::allocator<imrt::Volume>_> *volumes,int max_intensity,
          int initial_intensity,int step_intensity)

{
  _List_node_base *p_Var1;
  Station *this_00;
  Collimator *pCVar2;
  vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
  *pvVar3;
  Plan *this_01;
  int iVar4;
  int iVar5;
  mapped_type *pmVar6;
  ApertureILS *this_02;
  ostream *poVar7;
  pair<int,_int> p;
  vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
  *pvVar8;
  vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
  *pvVar9;
  difference_type __d;
  vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
  *pvVar10;
  int i;
  long lVar11;
  int r;
  long lVar12;
  double dVar13;
  key_type_conflict local_11c;
  vector<maths::Matrix,_std::allocator<maths::Matrix>_> *local_118;
  long local_110;
  Plan *local_108;
  vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
  *local_100;
  double local_f8;
  Matrix local_f0;
  map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
  mheuristic;
  vector<double,_std::allocator<double>_> local_78;
  vector<double,_std::allocator<double>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  
  iVar4 = Collimator::getNbAngles(this->collimator);
  if (0 < iVar4) {
    local_118 = &this->iheuristic;
    local_100 = &this->heuristic;
    local_110 = 0;
    do {
      mheuristic._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      mheuristic._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      mheuristic._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &mheuristic._M_t._M_impl.super__Rb_tree_header._M_header;
      mheuristic._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      iVar4 = this->max_apertures;
      mheuristic._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           mheuristic._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      iVar5 = Collimator::getIntensityLevelSize(this->collimator);
      maths::Matrix::Matrix(&local_f0,iVar4,iVar5);
      std::vector<maths::Matrix,_std::allocator<maths::Matrix>_>::emplace_back<maths::Matrix>
                (local_118,&local_f0);
      maths::Matrix::~Matrix(&local_f0);
      local_11c = 0;
      if (0 < this->max_apertures) {
        local_f8 = (double)(local_110 << 4);
        lVar11 = 0;
        do {
          for (; iVar4 = Collimator::getIntensityLevelSize(this->collimator), lVar11 < iVar4;
              lVar11 = lVar11 + 1) {
            *(undefined8 *)
             (*(long *)(*(long *)((long)&((local_118->
                                          super__Vector_base<maths::Matrix,_std::allocator<maths::Matrix>_>
                                          )._M_impl.super__Vector_impl_data._M_start)->p +
                                 (long)local_f8) + (long)local_11c * 8) + lVar11 * 8) =
                 0x3fe0000000000000;
          }
          iVar4 = Collimator::getXdim(this->collimator);
          iVar5 = Collimator::getReferenceSize(this->collimator);
          maths::Matrix::Matrix(&local_f0,iVar4,iVar5);
          pmVar6 = std::
                   map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                   ::operator[]((map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                                 *)&mheuristic._M_t,&local_11c);
          maths::Matrix::operator=(pmVar6,&local_f0);
          maths::Matrix::~Matrix(&local_f0);
          for (lVar11 = 0; iVar4 = Collimator::getXdim(this->collimator), lVar11 < iVar4;
              lVar11 = lVar11 + 1) {
            for (lVar12 = 0; iVar4 = Collimator::getReferenceSize(this->collimator), lVar12 < iVar4;
                lVar12 = lVar12 + 1) {
              pmVar6 = std::
                       map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                       ::operator[]((map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                                     *)&mheuristic._M_t,&local_11c);
              pmVar6->p[lVar11][lVar12] = 0.5;
            }
          }
          local_11c = local_11c + 1;
          lVar11 = 0;
        } while (local_11c < this->max_apertures);
      }
      std::
      vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
      ::push_back(local_100,(value_type *)&mheuristic._M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_maths::Matrix>,_std::_Select1st<std::pair<const_int,_maths::Matrix>_>,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
      ::~_Rb_tree(&mheuristic._M_t);
      lVar11 = local_110 + 1;
      iVar4 = Collimator::getNbAngles(this->collimator);
      local_110 = lVar11;
    } while (lVar11 < iVar4);
  }
  this_02 = (ApertureILS *)operator_new(0x78);
  ApertureILS::ApertureILS(this_02,1,1,true,true,1.0,step_intensity,100.0,0.5,false,0,0,0);
  this->ils = this_02;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Initializing heuristic information with ",0x28);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ls executions",0xe);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  iVar4 = 0;
  do {
    local_108 = (Plan *)operator_new(0xd0);
    std::vector<double,_std::allocator<double>_>::vector(&local_60,w);
    std::vector<double,_std::allocator<double>_>::vector(&local_78,Zmin);
    std::vector<double,_std::allocator<double>_>::vector(&local_48,Zmax);
    Plan::Plan(local_108,&local_60,&local_78,&local_48,this->collimator,volumes,this->max_apertures,
               max_intensity,initial_intensity,step_intensity,-1,0,(char *)0x0);
    if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    this_01 = local_108;
    ApertureILS::simpleLocalSearch(this->ils,local_108,false);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," Local search ",0xe);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
    dVar13 = Plan::getEvaluation(this_01);
    poVar7 = std::ostream::_M_insert<double>(dVar13);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    local_118 = (vector<maths::Matrix,_std::allocator<maths::Matrix>_> *)
                Plan::getEvaluation(this_01);
    iVar5 = Collimator::getNbAngles(this->collimator);
    if (0 < iVar5) {
      local_f8 = 5.0 / (double)local_118;
      pvVar8 = (vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                *)0x0;
      pvVar10 = (vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                 *)0x0;
      do {
        p_Var1 = (local_108->stations).
                 super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl._M_node
                 .super__List_node_base._M_next;
        pvVar9 = pvVar8;
        pvVar3 = pvVar10;
        while (pvVar3 != (vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                          *)0x0) {
          p_Var1 = p_Var1->_M_next;
          pvVar9 = (vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                    *)((long)&(pvVar9->
                              super__Vector_base<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1);
          pvVar3 = pvVar9;
        }
        this_00 = (Station *)p_Var1[1]._M_next;
        mheuristic._M_t._M_impl._0_4_ = 0;
        local_100 = pvVar10;
        if (0 < this->max_apertures) {
          local_110 = (long)pvVar10 * 0x10;
          do {
            pCVar2 = this->collimator;
            dVar13 = Station::getApertureIntensity(this_00,mheuristic._M_t._M_impl._0_4_);
            iVar5 = Collimator::getIntensityLevel(pCVar2,dVar13);
            lVar11 = *(long *)(*(long *)((long)&((this->iheuristic).
                                                 super__Vector_base<maths::Matrix,_std::allocator<maths::Matrix>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->p +
                                        local_110) + (long)(int)mheuristic._M_t._M_impl._0_4_ * 8);
            *(double *)(lVar11 + (long)iVar5 * 8) = *(double *)(lVar11 + (long)iVar5 * 8) + local_f8
            ;
            iVar5 = Collimator::getXdim(this->collimator);
            if (0 < iVar5) {
              lVar11 = 0;
              do {
                pCVar2 = this->collimator;
                p = Station::getApertureShape(this_00,mheuristic._M_t._M_impl._0_4_,(int)lVar11);
                iVar5 = Collimator::searchReferenceIndex(pCVar2,p);
                pmVar6 = std::
                         map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                         ::operator[]((this->heuristic).
                                      super__Vector_base<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + (long)pvVar10,
                                      (key_type_conflict *)&mheuristic);
                local_118 = (vector<maths::Matrix,_std::allocator<maths::Matrix>_> *)
                            (pmVar6->p[lVar11][iVar5] + local_f8);
                pmVar6 = std::
                         map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                         ::operator[]((this->heuristic).
                                      super__Vector_base<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + (long)pvVar10,
                                      (key_type_conflict *)&mheuristic);
                pmVar6->p[lVar11][iVar5] = (double)local_118;
                lVar11 = lVar11 + 1;
                iVar5 = Collimator::getXdim(this->collimator);
              } while (lVar11 < iVar5);
            }
            mheuristic._M_t._M_impl._0_4_ = mheuristic._M_t._M_impl._0_4_ + 1;
          } while ((int)mheuristic._M_t._M_impl._0_4_ < this->max_apertures);
        }
        pvVar10 = (vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                   *)((long)&(local_100->
                             super__Vector_base<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 1);
        iVar5 = Collimator::getNbAngles(this->collimator);
        pvVar8 = (vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                  *)((long)&pvVar8[-1].
                            super__Vector_base<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      } while ((long)pvVar10 < (long)iVar5);
    }
    iVar4 = iVar4 + 1;
  } while (iVar4 != 5);
  return;
}

Assistant:

void initializeHeuristic (vector<double> w, vector<double> Zmin, vector<double> Zmax, vector<Volume>& volumes, 
                            int max_intensity, int initial_intensity, int step_intensity) {
    int nls=5;
    //Initialize structure
    for (int s=0; s< collimator.getNbAngles();s++) {
      map<int, Matrix> mheuristic;
      iheuristic.push_back(Matrix(max_apertures,  collimator.getIntensityLevelSize()));
      for (int a=0; a< max_apertures; a++) {
        for (int i=0; i< collimator.getIntensityLevelSize(); i++){
          iheuristic[s](a,i) = 0.5;
        }
        mheuristic[a] = Matrix(collimator.getXdim(), collimator.getReferenceSize());
        for (int j = 0; j < collimator.getXdim(); j++) {
          for (int r = 0; r < collimator.getReferenceSize(); r++) {
            mheuristic[a](j,r) =0.5;
          }
        }
      }
      heuristic.push_back(mheuristic);
    }
    
    //Perform local search and generate heuristic information
    Station *st;
    int aux;
    double deposit;
    ils = new ApertureILS(1, 1, true, true, 1, step_intensity, 100, 0.5, false, 0, ILS::ACCEPT_NONE, ApertureILS::FIRST_IMPROVEMENT);
    cout << "Initializing heuristic information with " << nls << " ls executions"<< endl;
    for (int i=0 ;i < nls; i++) {
      Plan *p = new Plan(w, Zmin, Zmax, collimator, volumes, max_apertures, max_intensity, initial_intensity, step_intensity, -1, Station::OPEN_MIN_SETUP);
      ils->simpleLocalSearch (*p, false);
      cout << " Local search "<<i<<": "<< p->getEvaluation() << endl;
      
      // Place deposit in heuristic information
      deposit = 5.0/p->getEvaluation();
      for (int s = 0; s < collimator.getNbAngles(); s++) {
        st = p->get_station(s);
        for (int a = 0; a < max_apertures; a++) {
          // Intensity heuristic 
          aux = collimator.getIntensityLevel(st->getApertureIntensity(a));
          iheuristic[s](a,aux) = iheuristic[s](a,aux) + deposit;
          // Aperture heuristic
          for (int j = 0; j < collimator.getXdim(); j++) {
            aux = collimator.searchReferenceIndex(st->getApertureShape(a, j));
            heuristic[s][a](j,aux) = heuristic[s][a](j,aux) + deposit;
          }
        }
      }
    }
  }